

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_read_tx_mode(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_U8 RVar1;
  RK_S32 RVar2;
  RK_U8 local_30 [8];
  RK_U32 value;
  RK_S32 err;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  if (ctx->coded_lossless == 0) {
    _value = current;
    current_local = (AV1RawFrameHeader *)gb;
    gb_local = &ctx->gb;
    RVar2 = mpp_av1_read_unsigned(gb,1,"tx_mode",(RK_U32 *)local_30,0,1);
    if (RVar2 < 0) {
      return RVar2;
    }
    _value->tx_mode = local_30[0];
    RVar1 = '\x01';
    if (_value->tx_mode != '\0') {
      RVar1 = '\x02';
    }
    _value->tx_mode = RVar1;
  }
  else {
    current->tx_mode = '\0';
  }
  return 0;
}

Assistant:

static RK_S32 mpp_av1_read_tx_mode(AV1Context *ctx, BitReadCtx_t *gb,
                                   AV1RawFrameHeader *current)
{
    RK_S32 err;

    if (ctx->coded_lossless)
        infer(tx_mode, 0);
    else {
        flag(tx_mode);
        current->tx_mode = current->tx_mode ? TX_MODE_SELECT : TX_MODE_LARGEST;
    }

    return 0;
}